

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_ui.cpp
# Opt level: O0

bool InitError(bilingual_str *str,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *details)

{
  long lVar1;
  byte bVar2;
  string *in_RSI;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef8;
  bilingual_str *in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff08;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff0c;
  bilingual_str *in_stack_ffffffffffffff10;
  bool local_e1;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  allocator<char> in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  bilingual_str *in_stack_ffffffffffffff60;
  bilingual_str *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_e1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::empty(in_stack_fffffffffffffef8);
  bVar5 = 0;
  bVar4 = 0;
  bVar3 = 0;
  if (local_e1) {
    bilingual_str::bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffff0c,(uint)in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff38,
               (char *)CONCAT17(in_stack_ffffffffffffff37,
                                CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
               in_RDI);
    bVar5 = 1;
    Untranslated(in_RSI);
    bVar4 = 1;
    util::MakeUnorderedList
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffef7,
                           CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
    bVar3 = 1;
    tinyformat::format<bilingual_str,std::__cxx11::string>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  local_e1 = !local_e1;
  bVar2 = InitError(in_stack_ffffffffffffff10);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffee8);
  if ((bVar3 & 1) != 0) {
    std::__cxx11::string::~string(&in_stack_fffffffffffffee8->original);
  }
  if ((bVar4 & 1) != 0) {
    bilingual_str::~bilingual_str(in_stack_fffffffffffffee8);
  }
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::~string(&in_stack_fffffffffffffee8->original);
  }
  if (local_e1) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool InitError(const bilingual_str& str, const std::vector<std::string>& details)
{
    // For now just flatten the list of error details into a string to pass to
    // the base InitError overload. In the future, if more init code provides
    // error details, the details could be passed separately from the main
    // message for rich display in the GUI. But currently the only init
    // functions which provide error details are ones that run during early init
    // before the GUI uiInterface is registered, so there's no point passing
    // main messages and details separately to uiInterface yet.
    return InitError(details.empty() ? str : strprintf(Untranslated("%s:\n%s"), str, MakeUnorderedList(details)));
}